

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

int djgt__count(djg_texture *texture)

{
  int iVar1;
  
  iVar1 = -1;
  do {
    texture = texture->next;
    iVar1 = iVar1 + 1;
  } while (texture != (djg_texture *)0x0);
  return iVar1;
}

Assistant:

static int djgt__count(const djg_texture *texture)
{
    const djg_texture *it = texture;
    int i = 0;

    while (it->next) {
        it = it->next;
        ++i;
    }

    return i;
}